

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::TransferCompoundedAddSubUsesToSrcs(BackwardPass *this,Instr *instr,int addSubUses)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  int iVar4;
  undefined4 *puVar5;
  StackSym *stackSym;
  int i;
  long lVar6;
  Opnd *srcs [2];
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1d1e,"(instr)","instr");
    if (!bVar2) goto LAB_003ee316;
    *puVar5 = 0;
  }
  if (addSubUses < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1d1f,"(addSubUses >= 0)","addSubUses >= 0");
    if (!bVar2) goto LAB_003ee316;
    *puVar5 = 0;
  }
  if (0x15 < addSubUses) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1d20,"(addSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow)",
                       "addSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow");
    if (!bVar2) {
LAB_003ee316:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  srcs[0] = instr->m_src2;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  lVar6 = 0;
  do {
    if (srcs[lVar6 + -1] == (Opnd *)0x0) {
      return;
    }
    stackSym = IR::RegOpnd::TryGetStackSym(srcs[lVar6 + -1]);
    if (stackSym != (StackSym *)0x0) {
      if ((stackSym->scratch).globOpt.numCompoundedAddSubUses < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1d2d,"(srcSym->scratch.globOpt.numCompoundedAddSubUses >= 0)",
                           "srcSym->scratch.globOpt.numCompoundedAddSubUses >= 0");
        if (!bVar2) goto LAB_003ee316;
        *puVar5 = 0;
      }
      if (0x15 < (stackSym->scratch).globOpt.numCompoundedAddSubUses) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1d2e,
                           "(srcSym->scratch.globOpt.numCompoundedAddSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow)"
                           ,
                           "srcSym->scratch.globOpt.numCompoundedAddSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow"
                          );
        if (!bVar2) goto LAB_003ee316;
        *puVar5 = 0;
      }
      bVar2 = SetIntOverflowDoesNotMatterInRangeIfLastUse(this,stackSym,addSubUses);
      if ((!bVar2) &&
         (BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                            (this->intOverflowDoesNotMatterInRangeBySymId,(stackSym->super_Sym).m_id
                            ), BVar3 != '\0')) {
        iVar4 = (stackSym->scratch).globOpt.numCompoundedAddSubUses;
        if (iVar4 <= addSubUses) {
          iVar4 = addSubUses;
        }
        (stackSym->scratch).globOpt.numCompoundedAddSubUses = iVar4;
      }
    }
    lVar6 = lVar6 + 1;
    if (lVar6 != 1) {
      return;
    }
  } while( true );
}

Assistant:

void
BackwardPass::TransferCompoundedAddSubUsesToSrcs(IR::Instr *const instr, const int addSubUses)
{
    Assert(instr);
    Assert(addSubUses >= 0);
    Assert(addSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow);

    IR::Opnd *const srcs[] = { instr->GetSrc1(), instr->GetSrc2() };
    for(int i = 0; i < _countof(srcs) && srcs[i]; ++i)
    {
        StackSym *const srcSym = IR::RegOpnd::TryGetStackSym(srcs[i]);
        if(!srcSym)
        {
            // Int overflow tracking is only done for StackSyms in RegOpnds. Int overflow matters for the src, so it is
            // guaranteed to be in the int range at this point if the instruction is int-specialized.
            continue;
        }

        Assert(srcSym->scratch.globOpt.numCompoundedAddSubUses >= 0);
        Assert(srcSym->scratch.globOpt.numCompoundedAddSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow);

        if(SetIntOverflowDoesNotMatterInRangeIfLastUse(srcSym, addSubUses))
        {
            // This is the last use of the src
            continue;
        }

        if(intOverflowDoesNotMatterInRangeBySymId->Test(srcSym->m_id))
        {
            // Since a src may be compounded through different chains of add/sub instructions, the greater number must be
            // preserved
            srcSym->scratch.globOpt.numCompoundedAddSubUses =
                max(srcSym->scratch.globOpt.numCompoundedAddSubUses, addSubUses);
        }
        else
        {
            // Int overflow matters for the src, so it is guaranteed to be in the int range at this point if the instruction is
            // int-specialized
        }
    }
}